

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O2

int prvTidyEncodeCharToUTF8Bytes(uint c,tmbstr encodebuf,TidyOutputSink *outp,int *count)

{
  uint uVar1;
  byte *pbVar2;
  byte *pbVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  byte bVar7;
  long lVar8;
  byte bVar9;
  long lVar10;
  bool bVar11;
  long lStack_50;
  byte tempbuf [10];
  
  tempbuf[8] = '\0';
  tempbuf[9] = '\0';
  tempbuf[0] = '\0';
  tempbuf[1] = '\0';
  tempbuf[2] = '\0';
  tempbuf[3] = '\0';
  tempbuf[4] = '\0';
  tempbuf[5] = '\0';
  tempbuf[6] = '\0';
  tempbuf[7] = '\0';
  pbVar3 = (byte *)encodebuf;
  if (encodebuf == (tmbstr)0x0) {
    pbVar3 = tempbuf;
  }
  bVar7 = (byte)c;
  if (c < 0x80) {
    *pbVar3 = bVar7;
    bVar11 = true;
    uVar1 = 1;
LAB_0014e87c:
    if (bVar11 == true && outp != (TidyOutputSink *)0x0) {
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        (*outp->putByte)(outp->sinkData,pbVar3[uVar6]);
      }
    }
    *count = uVar1;
    return bVar11 - 1;
  }
  if (c < 0x800) {
    pbVar2 = tempbuf;
    if (encodebuf != (tmbstr)0x0) {
      pbVar2 = (byte *)encodebuf;
    }
    *pbVar3 = (byte)(c >> 6) | 0xc0;
    pbVar2[1] = bVar7 & 0x3f | 0x80;
    bVar11 = true;
    uVar1 = 2;
    goto LAB_0014e87c;
  }
  if (c < 0x10000) {
    *pbVar3 = (byte)(c >> 0xc) | 0xe0;
    pbVar2 = tempbuf;
    if (encodebuf != (tmbstr)0x0) {
      pbVar2 = (byte *)encodebuf;
    }
    pbVar2[1] = (byte)(c >> 6) & 0x3f | 0x80;
    pbVar2[2] = bVar7 & 0x3f | 0x80;
    bVar11 = (~c & 0xfffe) != 0;
    uVar1 = 3;
    goto LAB_0014e87c;
  }
  if (c < 0x200000) {
    *pbVar3 = (byte)(c >> 0x12) | 0xf0;
    pbVar2 = tempbuf;
    if (encodebuf != (tmbstr)0x0) {
      pbVar2 = (byte *)encodebuf;
    }
    pbVar2[1] = (byte)(c >> 0xc) & 0x3f | 0x80;
    pbVar2[2] = (byte)(c >> 6) & 0x3f | 0x80;
    pbVar2[3] = bVar7 & 0x3f | 0x80;
    bVar11 = c < 0x110000;
    uVar1 = 4;
    goto LAB_0014e87c;
  }
  bVar9 = (byte)(c >> 0x18);
  if (c < 0x4000000) {
    *pbVar3 = bVar9 | 0xf8;
    bVar9 = (byte)(c >> 0x12);
    iVar5 = 5;
    lVar4 = 4;
    lVar8 = 3;
    lVar10 = 2;
    lStack_50 = 1;
  }
  else {
    if ((int)c < 0) {
      iVar5 = 0;
      goto LAB_0014e979;
    }
    *pbVar3 = bVar9 >> 6 | 0xfc;
    pbVar3 = (byte *)encodebuf;
    if (encodebuf == (tmbstr)0x0) {
      pbVar3 = tempbuf;
    }
    pbVar3[1] = bVar9 & 0x3f | 0x80;
    bVar9 = (byte)(c >> 0x12) & 0x3f;
    iVar5 = 6;
    lVar4 = 5;
    lVar8 = 4;
    lVar10 = 3;
    lStack_50 = 2;
  }
  pbVar3 = tempbuf;
  if (encodebuf != (tmbstr)0x0) {
    pbVar3 = (byte *)encodebuf;
  }
  pbVar3[lStack_50] = bVar9 | 0x80;
  pbVar3[lVar10] = (byte)(c >> 0xc) & 0x3f | 0x80;
  pbVar3[lVar8] = (byte)(c >> 6) & 0x3f | 0x80;
  pbVar3[lVar4] = bVar7 & 0x3f | 0x80;
LAB_0014e979:
  *count = iVar5;
  return -1;
}

Assistant:

int TY_(EncodeCharToUTF8Bytes)( uint c, tmbstr encodebuf,
                                TidyOutputSink* outp, int* count )
{
    byte tempbuf[10] = {0};
    byte* buf = &tempbuf[0];
    int bytes = 0;
    Bool hasError = no;
    
    if ( encodebuf )
        buf = (byte*) encodebuf;
        
    if (c <= 0x7F)  /* 0XXX XXXX one byte */
    {
        buf[0] = (tmbchar) c;
        bytes = 1;
    }
    else if (c <= 0x7FF)  /* 110X XXXX  two bytes */
    {
        buf[0] = (tmbchar) ( 0xC0 | (c >> 6) );
        buf[1] = (tmbchar) ( 0x80 | (c & 0x3F) );
        bytes = 2;
    }
    else if (c <= 0xFFFF)  /* 1110 XXXX  three bytes */
    {
        buf[0] = (tmbchar) (0xE0 | (c >> 12));
        buf[1] = (tmbchar) (0x80 | ((c >> 6) & 0x3F));
        buf[2] = (tmbchar) (0x80 | (c & 0x3F));
        bytes = 3;
        if ( c == kUTF8ByteSwapNotAChar || c == kUTF8NotAChar )
            hasError = yes;
    }
    else if (c <= 0x1FFFFF)  /* 1111 0XXX  four bytes */
    {
        buf[0] = (tmbchar) (0xF0 | (c >> 18));
        buf[1] = (tmbchar) (0x80 | ((c >> 12) & 0x3F));
        buf[2] = (tmbchar) (0x80 | ((c >> 6) & 0x3F));
        buf[3] = (tmbchar) (0x80 | (c & 0x3F));
        bytes = 4;
        if (c > kMaxUTF8FromUCS4)
            hasError = yes;
    }
    else if (c <= 0x3FFFFFF)  /* 1111 10XX  five bytes */
    {
        buf[0] = (tmbchar) (0xF8 | (c >> 24));
        buf[1] = (tmbchar) (0x80 | (c >> 18));
        buf[2] = (tmbchar) (0x80 | ((c >> 12) & 0x3F));
        buf[3] = (tmbchar) (0x80 | ((c >> 6) & 0x3F));
        buf[4] = (tmbchar) (0x80 | (c & 0x3F));
        bytes = 5;
        hasError = yes;
    }
    else if (c <= 0x7FFFFFFF)  /* 1111 110X  six bytes */
    {
        buf[0] = (tmbchar) (0xFC | (c >> 30));
        buf[1] = (tmbchar) (0x80 | ((c >> 24) & 0x3F));
        buf[2] = (tmbchar) (0x80 | ((c >> 18) & 0x3F));
        buf[3] = (tmbchar) (0x80 | ((c >> 12) & 0x3F));
        buf[4] = (tmbchar) (0x80 | ((c >> 6) & 0x3F));
        buf[5] = (tmbchar) (0x80 | (c & 0x3F));
        bytes = 6;
        hasError = yes;
    }
    else
        hasError = yes;
        
    /* don't output invalid UTF-8 byte sequence to a stream */
    if ( !hasError && outp != NULL )
    {
        int ix;
        for ( ix=0; ix < bytes; ++ix )
          outp->putByte( outp->sinkData, buf[ix] );
    }

#if 1 && defined(_DEBUG)
    if ( hasError )
    {
        int i;
        fprintf( stderr, "UTF-8 encoding error for U+%x : ", c );
        for (i = 0; i < bytes; i++)
            fprintf( stderr, "0x%02x ", buf[i] );
        fprintf( stderr, "\n" );
    }
#endif
    
    *count = bytes;
    if (hasError)
        return -1;
    return 0;
}